

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::readBasisFile
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames)

{
  byte bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  spxifstream file;
  undefined6 in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc66;
  size_t in_stack_fffffffffffffc88;
  openmode in_stack_fffffffffffffc94;
  string *in_stack_fffffffffffffc98;
  ifstream *in_stack_fffffffffffffca0;
  long local_348 [100];
  undefined8 local_28;
  undefined8 local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffc98,in_RSI,(allocator *)&stack0xfffffffffffffc97);
  zstr::ifstream::ifstream
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc97);
  bVar1 = std::ios::operator!((void *)((long)local_348 + *(long *)(local_348[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    in_stack_fffffffffffffc66 =
         (**(code **)(*(long *)(in_RDI + 0x1c8) + 8))(in_RDI + 0x1c8,local_348,local_20,local_28);
    local_1 = in_stack_fffffffffffffc66 & 1;
  }
  else {
    local_1 = 0;
  }
  zstr::ifstream::~ifstream
            ((ifstream *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
  return (bool)(local_1 & 1);
}

Assistant:

bool SPxSolverBase<R>::readBasisFile(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   spxifstream file(filename);

   if(!file)
      return false;

   return this->readBasis(file, rowNames, colNames);
}